

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O1

Object<(anonymous_namespace)::CMakeVersion> * __thiscall
cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::
Bind<(anonymous_namespace)::CMakeVersion,unsigned_int,std::function<bool(unsigned_int&,Json::Value_const*,cmJSONState*)>>
          (Object<(anonymous_namespace)::CMakeVersion> *this,string_view *name,
          offset_in_CMakeVersion_to_unsigned_int member,
          function<bool_(unsigned_int_&,_const_Json::Value_*,_cmJSONState_*)> *func,bool required)

{
  pointer *ppMVar1;
  undefined8 *puVar2;
  pointer pMVar3;
  pointer pMVar4;
  _Manager_type p_Var5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  _func_bool__Any_data_ptr_CMakeVersion_ptr_Value_ptr_ptr_cmJSONState_ptr_ptr *__tmp_1;
  ulong uVar9;
  pointer pMVar10;
  ulong uVar11;
  long lVar12;
  pointer pMVar13;
  pointer pMVar14;
  undefined8 *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  undefined8 uStack_b0;
  _Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
  *local_a0;
  size_t local_98;
  char *pcStack_90;
  undefined8 *local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  undefined1 local_68;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  offset_in_CMakeVersion_to_unsigned_int local_38;
  
  std::function<bool_(unsigned_int_&,_const_Json::Value_*,_cmJSONState_*)>::function
            ((function<bool_(unsigned_int_&,_const_Json::Value_*,_cmJSONState_*)> *)&local_58,func);
  local_c8 = (undefined8 *)0x0;
  uStack_c0 = 0;
  local_b8 = (code *)0x0;
  uStack_b0 = 0;
  local_38 = member;
  local_c8 = (undefined8 *)operator_new(0x28);
  *local_c8 = 0;
  local_c8[1] = 0;
  local_c8[2] = 0;
  local_c8[3] = uStack_40;
  if (local_48 != (code *)0x0) {
    *local_c8 = local_58._M_unused._M_object;
    local_c8[1] = local_58._8_8_;
    local_c8[2] = local_48;
    local_48 = (code *)0x0;
    uStack_40 = 0;
  }
  local_c8[4] = member;
  local_98 = name->_M_len;
  pcStack_90 = name->_M_str;
  local_b8 = (code *)0x0;
  uStack_b0 = 0;
  uStack_80 = uStack_c0;
  local_78 = std::
             _Function_handler<bool_((anonymous_namespace)::CMakeVersion_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
             ::_M_manager;
  pcStack_70 = std::
               _Function_handler<bool_((anonymous_namespace)::CMakeVersion_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
               ::_M_invoke;
  local_68 = 0;
  pMVar3 = (this->Members).
           super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_88 = local_c8;
  if (pMVar3 == (this->Members).
                super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pMVar4 = (this->Members).
             super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar12 = (long)pMVar3 - (long)pMVar4;
    if (lVar12 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar11 = (lVar12 >> 3) * 0x6db6db6db6db6db7;
    uVar9 = 1;
    if (pMVar3 != pMVar4) {
      uVar9 = uVar11;
    }
    local_a0 = (_Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
                *)(uVar9 + uVar11);
    if ((_Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
         *)0x249249249249248 < local_a0) {
      local_a0 = (_Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
                  *)0x249249249249249;
    }
    if (CARRY8(uVar9,uVar11)) {
      local_a0 = (_Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
                  *)0x249249249249249;
    }
    pMVar10 = std::
              _Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
              ::_M_allocate(local_a0,(size_t)func);
    *(size_t *)((long)pMVar10 + lVar12) = local_98;
    ((size_t *)((long)pMVar10 + lVar12))[1] = (size_t)pcStack_90;
    puVar2 = (undefined8 *)((long)pMVar10 + lVar12 + 0x10);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined8 *)((long)pMVar10 + lVar12 + 0x20) = 0;
    *(code **)((long)pMVar10 + lVar12 + 0x28) = pcStack_70;
    if (local_78 != (code *)0x0) {
      *(undefined8 **)((long)pMVar10 + lVar12 + 0x10) = local_88;
      *(undefined8 *)((long)pMVar10 + lVar12 + 0x18) = uStack_80;
      *(code **)((long)pMVar10 + lVar12 + 0x20) = local_78;
      local_78 = (code *)0x0;
      pcStack_70 = (code *)0x0;
    }
    *(undefined1 *)((long)pMVar10 + lVar12 + 0x30) = local_68;
    pMVar14 = pMVar10;
    for (pMVar13 = pMVar4; pMVar3 != pMVar13; pMVar13 = pMVar13 + 1) {
      uVar6 = *(undefined4 *)((long)&(pMVar13->Name)._M_len + 4);
      uVar7 = *(undefined4 *)&(pMVar13->Name)._M_str;
      uVar8 = *(undefined4 *)((long)&(pMVar13->Name)._M_str + 4);
      *(int *)&(pMVar14->Name)._M_len = (int)(pMVar13->Name)._M_len;
      *(undefined4 *)((long)&(pMVar14->Name)._M_len + 4) = uVar6;
      *(undefined4 *)&(pMVar14->Name)._M_str = uVar7;
      *(undefined4 *)((long)&(pMVar14->Name)._M_str + 4) = uVar8;
      *(undefined8 *)&(pMVar14->Function).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(pMVar14->Function).super__Function_base._M_functor + 8) = 0;
      (pMVar14->Function).super__Function_base._M_manager = (_Manager_type)0x0;
      (pMVar14->Function)._M_invoker = (pMVar13->Function)._M_invoker;
      p_Var5 = (pMVar13->Function).super__Function_base._M_manager;
      if (p_Var5 != (_Manager_type)0x0) {
        uVar6 = *(undefined4 *)((long)&(pMVar13->Function).super__Function_base._M_functor + 4);
        uVar7 = *(undefined4 *)((long)&(pMVar13->Function).super__Function_base._M_functor + 8);
        uVar8 = *(undefined4 *)((long)&(pMVar13->Function).super__Function_base._M_functor + 0xc);
        *(undefined4 *)&(pMVar14->Function).super__Function_base._M_functor =
             *(undefined4 *)&(pMVar13->Function).super__Function_base._M_functor;
        *(undefined4 *)((long)&(pMVar14->Function).super__Function_base._M_functor + 4) = uVar6;
        *(undefined4 *)((long)&(pMVar14->Function).super__Function_base._M_functor + 8) = uVar7;
        *(undefined4 *)((long)&(pMVar14->Function).super__Function_base._M_functor + 0xc) = uVar8;
        (pMVar14->Function).super__Function_base._M_manager = p_Var5;
        (pMVar13->Function).super__Function_base._M_manager = (_Manager_type)0x0;
        (pMVar13->Function)._M_invoker = (_Invoker_type)0x0;
      }
      pMVar14->Required = pMVar13->Required;
      p_Var5 = (pMVar13->Function).super__Function_base._M_manager;
      if (p_Var5 != (_Manager_type)0x0) {
        (*p_Var5)((_Any_data *)&pMVar13->Function,(_Any_data *)&pMVar13->Function,__destroy_functor)
        ;
      }
      pMVar14 = pMVar14 + 1;
    }
    if (pMVar4 != (pointer)0x0) {
      operator_delete(pMVar4,(long)(this->Members).
                                   super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pMVar4
                     );
    }
    (this->Members).
    super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
    ._M_impl.super__Vector_impl_data._M_start = pMVar10;
    (this->Members).
    super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar14 + 1;
    (this->Members).
    super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar10 + (long)local_a0;
  }
  else {
    (pMVar3->Name)._M_len = local_98;
    (pMVar3->Name)._M_str = pcStack_90;
    *(undefined8 *)&(pMVar3->Function).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(pMVar3->Function).super__Function_base._M_functor + 8) = 0;
    (pMVar3->Function).super__Function_base._M_manager = (_Manager_type)0x0;
    (pMVar3->Function)._M_invoker =
         std::
         _Function_handler<bool_((anonymous_namespace)::CMakeVersion_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
         ::_M_invoke;
    *(undefined8 **)&(pMVar3->Function).super__Function_base._M_functor = local_c8;
    *(undefined8 *)((long)&(pMVar3->Function).super__Function_base._M_functor + 8) = uStack_c0;
    (pMVar3->Function).super__Function_base._M_manager =
         std::
         _Function_handler<bool_((anonymous_namespace)::CMakeVersion_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
         ::_M_manager;
    pcStack_70 = (code *)0x0;
    local_78 = (code *)0x0;
    pMVar3->Required = false;
    ppMVar1 = &(this->Members).
               super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,3);
  }
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,3);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return this;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(
        name,
        [func, member](T& out, const Json::Value* value, cmJSONState* state)
          -> bool { return func(out.*member, value, state); },
        required);
    }